

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O3

int quicly_sentmap_prepare
              (quicly_sentmap_t *map,uint64_t packet_number,int64_t now,uint8_t ack_epoch)

{
  st_quicly_sent_block_t *psVar1;
  st_quicly_sent_block_t *psVar2;
  st_quicly_sent_block_t *psVar3;
  size_t sVar4;
  
  if (map->_pending_packet != (quicly_sent_t *)0x0) {
    __assert_fail("map->_pending_packet == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                  ,0x61,"int quicly_sentmap_prepare(quicly_sentmap_t *, uint64_t, int64_t, uint8_t)"
                 );
  }
  psVar1 = map->tail;
  if ((psVar1 == (st_quicly_sent_block_t *)0x0) ||
     (sVar4 = psVar1->next_insert_at, psVar2 = psVar1, sVar4 == 0x10)) {
    psVar2 = (st_quicly_sent_block_t *)malloc(0x218);
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      map->_pending_packet = (quicly_sent_t *)0x0;
      return 0x201;
    }
    psVar2->next = (st_quicly_sent_block_t *)0x0;
    psVar2->num_entries = 0;
    psVar2->next_insert_at = 0;
    psVar3 = (st_quicly_sent_block_t *)&map->tail;
    if (psVar1 != (st_quicly_sent_block_t *)0x0) {
      psVar3 = psVar1;
    }
    psVar3->next = psVar2;
    (&map->head)[psVar1 != (st_quicly_sent_block_t *)0x0] = psVar2;
    sVar4 = 0;
  }
  psVar2->next_insert_at = sVar4 + 1;
  psVar2->num_entries = psVar2->num_entries + 1;
  psVar2->entries[sVar4].acked = quicly_sentmap__type_packet;
  map->_pending_packet = psVar2->entries + sVar4;
  psVar2->entries[sVar4].data.packet.packet_number = packet_number;
  psVar2->entries[sVar4].data.packet.sent_at = now;
  psVar2->entries[sVar4].data.packet.ack_epoch = ack_epoch;
  *(undefined1 *)((long)&psVar2->entries[sVar4].data + 0x11) = 0;
  psVar2->entries[sVar4].data.packet.cc_bytes_in_flight = 0;
  return 0;
}

Assistant:

int quicly_sentmap_prepare(quicly_sentmap_t *map, uint64_t packet_number, int64_t now, uint8_t ack_epoch)
{
    assert(map->_pending_packet == NULL);

    if ((map->_pending_packet = quicly_sentmap_allocate(map, quicly_sentmap__type_packet)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    map->_pending_packet->data.packet = (quicly_sent_packet_t){packet_number, now, ack_epoch};
    return 0;
}